

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool ppk_encrypted_f(Filename *filename,char **commentptr)

{
  LoadedFile *lf_00;
  _Bool toret;
  LoadedFile *lf;
  char **commentptr_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,(char **)0x0);
  if (lf_00 == (LoadedFile *)0x0) {
    if (commentptr != (char **)0x0) {
      *commentptr = (char *)0x0;
    }
    filename_local._7_1_ = false;
  }
  else {
    filename_local._7_1_ = ppk_encrypted_s(lf_00->binarysource_,commentptr);
    lf_free(lf_00);
  }
  return filename_local._7_1_;
}

Assistant:

bool ppk_encrypted_f(const Filename *filename, char **commentptr)
{
    LoadedFile *lf = lf_load_keyfile(filename, NULL);
    if (!lf) {
        if (commentptr)
            *commentptr = NULL;
        return false;
    }

    bool toret = ppk_encrypted_s(BinarySource_UPCAST(lf), commentptr);
    lf_free(lf);
    return toret;
}